

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O1

void __thiscall
ElementsAddressFactory_CreatePegInAddress1_Test::~ElementsAddressFactory_CreatePegInAddress1_Test
          (ElementsAddressFactory_CreatePegInAddress1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ElementsAddressFactory, CreatePegInAddress1)
{
  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Script fedpegscript("522102baae8e066e4f2a1da4b731017697bb8fcacc60e4569f3ec27bc31cf3fb13246221026bccd050e8ecf7a702bc9fb63205cfdf278a22ba8b1f1d3ca3d8e5b38465a9702103430d354b89d1fbe43eb54ea138a4aee1076e4c54f4c805f62f9cee965351a1d053ae");
  {
    ElementsAddressFactory factory(NetType::kMainnet);
    EXPECT_NO_THROW(Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, pubkey, fedpegscript));
    // error
    // EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wshAddress, pubkey, Script()), CfdException);
  }
  {
    ElementsAddressFactory factory(NetType::kRegtest);
    EXPECT_NO_THROW(Address address = factory.CreatePegInAddress(AddressType::kP2wshAddress, pubkey, fedpegscript));
    // error
    // EXPECT_THROW(factory.CreatePegInAddress(AddressType::kP2wshAddress, pubkey, Script()), CfdException);
  }
}